

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffexts(char *extspec,int *extnum,char *extname,int *extvers,int *hdutype,char *imagecolname,
          char *rowexpress,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  char *local_b0;
  char *loc;
  char tmpname [71];
  int notint;
  int nvals;
  int slen;
  char *ptr2;
  char *ptr1;
  char *imagecolname_local;
  int *hdutype_local;
  int *extvers_local;
  char *extname_local;
  int *extnum_local;
  char *extspec_local;
  
  stack0xffffffffffffffa4 = 1;
  *extnum = 0;
  *extname = '\0';
  *extvers = 0;
  *hdutype = -1;
  *imagecolname = '\0';
  *rowexpress = '\0';
  ptr2 = extspec;
  if (0 < *status) {
    return *status;
  }
  for (; *ptr2 == ' '; ptr2 = ptr2 + 1) {
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)*ptr2] & 0x800) != 0) {
    stack0xffffffffffffffa4 = 0;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(ptr2,&local_b0,10);
    *extnum = (int)lVar4;
    for (; *local_b0 == ' '; local_b0 = local_b0 + 1) {
    }
    if (((*local_b0 != '\0') && (*local_b0 != ';')) ||
       (piVar3 = __errno_location(), *piVar3 == 0x22)) {
      *extnum = 0;
      stack0xffffffffffffffa4 = 1;
      piVar3 = __errno_location();
      *piVar3 = 0;
    }
    if ((*extnum < 0) || (99999 < *extnum)) {
      *extnum = 0;
      ffpmsg("specified extension number is out of range:");
      ffpmsg(extspec);
      *status = 0x7d;
      return 0x7d;
    }
  }
  if (stack0xffffffffffffffa4 != 0) {
    sVar5 = strcspn(ptr2,",:;");
    notint = (int)sVar5;
    if (0x46 < notint) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(extname,ptr2,(long)notint);
    while( true ) {
      bVar8 = false;
      if (0 < notint) {
        bVar8 = extname[(long)notint + -1] == ' ';
      }
      if (!bVar8) break;
      extname[(long)notint + -1] = '\0';
      notint = notint + -1;
    }
    sVar5 = strspn(ptr2 + notint," ,:");
    ptr2 = ptr2 + notint + (int)sVar5;
    sVar5 = strcspn(ptr2," ,:;");
    if ((int)sVar5 == 0) {
      strcpy((char *)&loc,extname);
      ffupch((char *)&loc);
      iVar1 = strcmp((char *)&loc,"PRIMARY");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)&loc,"P"), iVar1 == 0)) {
        *extname = '\0';
      }
    }
    else {
      iVar1 = __isoc99_sscanf(ptr2,"%d",extvers);
      if (iVar1 != 1) {
        ffpmsg("illegal EXTVER value in input URL:");
        ffpmsg(extspec);
        *status = 0x7d;
        return 0x7d;
      }
      sVar6 = strspn(ptr2 + (int)sVar5," ,:");
      ptr2 = ptr2 + (int)sVar5 + (int)sVar6;
      sVar5 = strcspn(ptr2,";");
      if ((int)sVar5 != 0) {
        if ((*ptr2 == 'b') || (*ptr2 == 'B')) {
          *hdutype = 2;
        }
        else if ((((*ptr2 == 't') || (*ptr2 == 'T')) || (*ptr2 == 'a')) || (*ptr2 == 'A')) {
          *hdutype = 1;
        }
        else {
          if ((*ptr2 != 'i') && (*ptr2 != 'I')) {
            ffpmsg("unknown type of HDU in input URL:");
            ffpmsg(extspec);
            *status = 0x7d;
            return 0x7d;
          }
          *hdutype = 0;
        }
      }
    }
  }
  ptr2 = strchr(ptr2,0x3b);
  if (ptr2 != (char *)0x0) {
    do {
      ptr2 = ptr2 + 1;
    } while (*ptr2 == ' ');
    _nvals = strchr(ptr2,0x28);
    if (_nvals == (char *)0x0) {
      ffpmsg("illegal specification of image in table cell in input URL:");
      ffpmsg(" did not find a row expression enclosed in ( )");
      ffpmsg(extspec);
      *status = 0x7d;
      return 0x7d;
    }
    if (0x400 < (long)_nvals - (long)ptr2) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(imagecolname,ptr2,(long)_nvals - (long)ptr2);
    do {
      _nvals = _nvals + 1;
    } while (*_nvals == ' ');
    pcVar7 = strchr(_nvals,0x29);
    if (pcVar7 == (char *)0x0) {
      ffpmsg("illegal specification of image in table cell in input URL:");
      ffpmsg(" missing closing \')\' character in row expression");
      ffpmsg(extspec);
      *status = 0x7d;
      return 0x7d;
    }
    if (0x400 < (long)pcVar7 - (long)_nvals) {
      *status = 0x7d;
      return 0x7d;
    }
    strncat(rowexpress,_nvals,(long)pcVar7 - (long)_nvals);
  }
  return *status;
}

Assistant:

int ffexts(char *extspec, 
                       int *extnum, 
                       char *extname,
                       int *extvers,
                       int *hdutype,
                       char *imagecolname,
                       char *rowexpress,
                       int *status)
{
/*
   Parse the input extension specification string, returning either the
   extension number or the values of the EXTNAME, EXTVERS, and XTENSION
   keywords in desired extension. Also return the name of the column containing
   an image, and an expression to be used to determine which row to use,
   if present.
*/
    char *ptr1, *ptr2;
    int slen, nvals;
    int notint = 1; /* initially assume specified extname is not an integer */
    char tmpname[FLEN_VALUE], *loc;

    *extnum = 0;
    *extname = '\0';
    *extvers = 0;
    *hdutype = ANY_HDU;
    *imagecolname = '\0';
    *rowexpress = '\0';

    if (*status > 0)
        return(*status);

    ptr1 = extspec;       /* pointer to first char */

    while (*ptr1 == ' ')  /* skip over any leading blanks */
        ptr1++;

    if (isdigit((int) *ptr1))  /* is the extension specification a number? */
    {
        notint = 0;  /* looks like extname may actually be the ext. number */
        errno = 0;  /* reset this prior to calling strtol */
        *extnum = strtol(ptr1, &loc, 10);  /* read the string as an integer */

        while (*loc == ' ')  /* skip over trailing blanks */
           loc++;

        /* check for read error, or junk following the integer */
        if ((*loc != '\0' && *loc != ';' ) || (errno == ERANGE) )
        {
           *extnum = 0;
           notint = 1;  /* no, extname was not a simple integer after all */
           errno = 0;  /* reset error condition flag if it was set */
        }

        if ( *extnum < 0 || *extnum > 99999)
        {
            *extnum = 0;   /* this is not a reasonable extension number */
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }


/*  This logic was too simple, and failed on extnames like '1000TEMP' 
    where it would try to move to the 1000th extension

    if (isdigit((int) *ptr1))  
    {
        sscanf(ptr1, "%d", extnum);
        if (*extnum < 0 || *extnum > 9999)
        {
            *extnum = 0;   
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }
*/

    if (notint)
    {
           /* not a number, so EXTNAME must be specified, followed by */
           /* optional EXTVERS and XTENSION  values */

           /* don't use space char as end indicator, because there */
           /* may be imbedded spaces in the EXTNAME value */
           slen = strcspn(ptr1, ",:;");   /* length of EXTNAME */

	   if (slen > FLEN_VALUE - 1)
	   {
                return(*status = URL_PARSE_ERROR); 
           }
 
           strncat(extname, ptr1, slen);  /* EXTNAME value */

           /* now remove any trailing blanks */
           while (slen > 0 && *(extname + slen -1) == ' ')
           {
               *(extname + slen -1) = '\0';
               slen--;
           }

           ptr1 += slen;
           slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
           ptr1 += slen;

           slen = strcspn(ptr1, " ,:;");   /* length of EXTVERS */
           if (slen)
           {
               nvals = sscanf(ptr1, "%d", extvers);  /* EXTVERS value */
               if (nvals != 1)
               {
                   ffpmsg("illegal EXTVER value in input URL:");
                   ffpmsg(extspec);
                   return(*status = URL_PARSE_ERROR);
               }

               ptr1 += slen;
               slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
               ptr1 += slen;

               slen = strcspn(ptr1, ";");   /* length of HDUTYPE */
               if (slen)
               {
                 if (*ptr1 == 'b' || *ptr1 == 'B')
                     *hdutype = BINARY_TBL;  
                 else if (*ptr1 == 't' || *ptr1 == 'T' ||
                          *ptr1 == 'a' || *ptr1 == 'A')
                     *hdutype = ASCII_TBL;
                 else if (*ptr1 == 'i' || *ptr1 == 'I')
                     *hdutype = IMAGE_HDU;
                 else
                 {
                     ffpmsg("unknown type of HDU in input URL:");
                     ffpmsg(extspec);
                     return(*status = URL_PARSE_ERROR);
                 }
               }
           }
           else
           {
                strcpy(tmpname, extname);
                ffupch(tmpname);
                if (!strcmp(tmpname, "PRIMARY") || !strcmp(tmpname, "P") )
                    *extname = '\0';  /* return extnum = 0 */
           }
    }

    ptr1 = strchr(ptr1, ';');
    if (ptr1)
    {
        /* an image is to be opened; the image is contained in a single */
        /* cell of a binary table.  A column name and an expression to  */
        /* determine which row to use has been entered.                 */

        ptr1++;  /* skip over the ';' delimiter */
        while (*ptr1 == ' ')  /* skip over any leading blanks */
            ptr1++;

        ptr2 = strchr(ptr1, '(');
        if (!ptr2)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" did not find a row expression enclosed in ( )");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	{
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(imagecolname, ptr1, ptr2 - ptr1); /* copy column name */

        ptr2++;  /* skip over the '(' delimiter */
        while (*ptr2 == ' ')  /* skip over any leading blanks */
            ptr2++;


        ptr1 = strchr(ptr2, ')');
        if (!ptr1)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" missing closing ')' character in row expression");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr1 - ptr2 > FLEN_FILENAME - 1)
        {
                return(*status = URL_PARSE_ERROR); 
        }
 
        strncat(rowexpress, ptr2, ptr1 - ptr2); /* row expression */
    }

    return(*status);
}